

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O3

int read_inter_segment_id(AV1_COMMON *cm,MACROBLOCKD *xd,int preskip,aom_reader *r)

{
  ushort uVar1;
  ushort uVar2;
  MB_MODE_INFO *pMVar3;
  FRAME_CONTEXT *pFVar4;
  short sVar5;
  uint uVar6;
  byte bVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  uint8_t *puVar11;
  uint x_mis;
  uint y_mis;
  aom_cdf_prob (*icdf) [3];
  uint8_t *puVar12;
  ulong uVar13;
  long lVar14;
  
  pMVar3 = *xd->mi;
  iVar10 = (cm->mi_params).mi_cols;
  lVar14 = (long)iVar10;
  x_mis = iVar10 - xd->mi_col;
  if ((int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                 [pMVar3->bsize] <= (int)x_mis) {
    x_mis = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                  [pMVar3->bsize];
  }
  y_mis = (cm->mi_params).mi_rows - xd->mi_row;
  if ((int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                 [pMVar3->bsize] <= (int)y_mis) {
    y_mis = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                  [pMVar3->bsize];
  }
  if ((cm->seg).enabled == '\0') {
    return 0;
  }
  iVar10 = xd->mi_row * iVar10 + xd->mi_col;
  if ((cm->seg).update_map == '\0') {
    puVar11 = cm->last_frame_seg_map;
    puVar12 = cm->cur_frame->seg_map;
    if (puVar11 == (uint8_t *)0x0) {
      if (0 < (int)y_mis) {
        uVar13 = (ulong)y_mis;
        puVar12 = puVar12 + iVar10;
        do {
          memset(puVar12,0,(long)(int)x_mis);
          puVar12 = puVar12 + lVar14;
          uVar13 = uVar13 - 1;
        } while (uVar13 != 0);
      }
    }
    else if (0 < (int)y_mis) {
      lVar9 = (long)iVar10;
      uVar13 = (ulong)y_mis;
      do {
        memcpy(puVar12 + lVar9,puVar11 + lVar9,(long)(int)x_mis);
        lVar9 = lVar9 + lVar14;
        uVar13 = uVar13 - 1;
      } while (uVar13 != 0);
    }
    iVar10 = get_predicted_segment_id(cm,iVar10,x_mis,y_mis);
    return iVar10;
  }
  if (preskip == 0) {
    if (pMVar3->skip_txfm != '\0') {
      if ((cm->seg).temporal_update != '\0') {
        pMVar3->field_0xa7 = pMVar3->field_0xa7 & 0xf7;
      }
      uVar6 = read_segment_id(cm,xd,r,1);
      if (0 < (int)y_mis) {
        puVar11 = cm->cur_frame->seg_map + iVar10;
        uVar13 = (ulong)y_mis;
        do {
          memset(puVar11,uVar6 & 0xff,(long)(int)x_mis);
          puVar11 = puVar11 + lVar14;
          uVar13 = uVar13 - 1;
        } while (uVar13 != 0);
      }
      goto LAB_00186c62;
    }
  }
  else if ((cm->seg).segid_preskip == '\0') {
    return 0;
  }
  if ((cm->seg).temporal_update == '\0') {
LAB_00186c14:
    uVar6 = read_segment_id(cm,xd,r,0);
  }
  else {
    if (xd->above_mbmi == (MB_MODE_INFO *)0x0) {
      uVar13 = 0;
    }
    else {
      uVar13 = (ulong)(*(ushort *)&xd->above_mbmi->field_0xa7 >> 3 & 1);
    }
    if (xd->left_mbmi == (MB_MODE_INFO *)0x0) {
      uVar8 = 0;
    }
    else {
      uVar8 = (ulong)(*(ushort *)&xd->left_mbmi->field_0xa7 >> 3 & 1);
    }
    lVar9 = uVar8 + uVar13;
    pFVar4 = xd->tile_ctx;
    icdf = (pFVar4->seg).pred_cdf + lVar9;
    uVar6 = od_ec_decode_cdf_q15(&r->ec,*icdf,2);
    if (r->allow_update_cdf != '\0') {
      uVar1 = (pFVar4->seg).pred_cdf[lVar9][2];
      bVar7 = (char)(uVar1 >> 4) + 4;
      uVar2 = (*icdf)[0];
      if ((char)uVar6 < '\x01') {
        sVar5 = -(uVar2 >> (bVar7 & 0x1f));
      }
      else {
        sVar5 = (short)((int)(0x8000 - (uint)uVar2) >> (bVar7 & 0x1f));
      }
      (*icdf)[0] = sVar5 + uVar2;
      (pFVar4->seg).pred_cdf[lVar9][2] = uVar1 + (uVar1 < 0x20);
    }
    *(ushort *)&pMVar3->field_0xa7 =
         (*(ushort *)&pMVar3->field_0xa7 & 0xfff7) + (short)(uVar6 & 1) * 8;
    if ((uVar6 & 1) == 0) goto LAB_00186c14;
    uVar6 = get_predicted_segment_id(cm,iVar10,x_mis,y_mis);
  }
  if (0 < (int)y_mis) {
    puVar11 = cm->cur_frame->seg_map + iVar10;
    uVar13 = (ulong)y_mis;
    do {
      memset(puVar11,uVar6 & 0xff,(long)(int)x_mis);
      puVar11 = puVar11 + lVar14;
      uVar13 = uVar13 - 1;
    } while (uVar13 != 0);
  }
LAB_00186c62:
  return uVar6 & 0xff;
}

Assistant:

static int read_inter_segment_id(AV1_COMMON *const cm, MACROBLOCKD *const xd,
                                 int preskip, aom_reader *r) {
  struct segmentation *const seg = &cm->seg;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  const int mi_offset = mi_row * mi_params->mi_cols + mi_col;
  const int bw = mi_size_wide[mbmi->bsize];
  const int bh = mi_size_high[mbmi->bsize];

  // TODO(slavarnway): move x_mis, y_mis into xd ?????
  const int x_mis = AOMMIN(mi_params->mi_cols - mi_col, bw);
  const int y_mis = AOMMIN(mi_params->mi_rows - mi_row, bh);

  if (!seg->enabled) return 0;  // Default for disabled segmentation

  if (!seg->update_map) {
    copy_segment_id(mi_params, cm->last_frame_seg_map, cm->cur_frame->seg_map,
                    mi_offset, x_mis, y_mis);
    return get_predicted_segment_id(cm, mi_offset, x_mis, y_mis);
  }

  uint8_t segment_id;
  const int mi_stride = cm->mi_params.mi_cols;
  if (preskip) {
    if (!seg->segid_preskip) return 0;
  } else {
    if (mbmi->skip_txfm) {
      if (seg->temporal_update) {
        mbmi->seg_id_predicted = 0;
      }
      segment_id = read_segment_id(cm, xd, r, 1);
      set_segment_id(cm->cur_frame->seg_map, mi_offset, x_mis, y_mis, mi_stride,
                     segment_id);
      return segment_id;
    }
  }

  if (seg->temporal_update) {
    const uint8_t ctx = av1_get_pred_context_seg_id(xd);
    FRAME_CONTEXT *ec_ctx = xd->tile_ctx;
    struct segmentation_probs *const segp = &ec_ctx->seg;
    aom_cdf_prob *pred_cdf = segp->pred_cdf[ctx];
    mbmi->seg_id_predicted = aom_read_symbol(r, pred_cdf, 2, ACCT_STR);
    if (mbmi->seg_id_predicted) {
      segment_id = get_predicted_segment_id(cm, mi_offset, x_mis, y_mis);
    } else {
      segment_id = read_segment_id(cm, xd, r, 0);
    }
  } else {
    segment_id = read_segment_id(cm, xd, r, 0);
  }
  set_segment_id(cm->cur_frame->seg_map, mi_offset, x_mis, y_mis, mi_stride,
                 segment_id);
  return segment_id;
}